

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O2

Result * __thiscall
CoreML::Model::addOutput
          (Result *__return_storage_ptr__,Model *this,string *targetName,FeatureType *targetType)

{
  ModelDescription *pMVar1;
  FeatureDescription *this_00;
  FeatureType *pFVar2;
  
  pMVar1 = Specification::Model::mutable_description
                     ((this->m_spec).
                      super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  this_00 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                      (&pMVar1->output_);
  Specification::FeatureDescription::set_name(this_00,targetName);
  pFVar2 = FeatureType::allocateCopy(targetType);
  if (this_00->type_ != (FeatureType *)0x0) {
    (*(this_00->type_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this_00->type_ = pFVar2;
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Result Model::addOutput(const std::string& targetName,
                            FeatureType targetType) {
        Specification::ModelDescription* interface = m_spec->mutable_description();
        Specification::FeatureDescription *arg = interface->add_output();
        arg->set_name(targetName);
        arg->set_allocated_type(targetType.allocateCopy());
        return Result();
    }